

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

SharedPtr<KeyFileReader<NWN::ResRef16>_> * __thiscall
swutil::SharedPtr<KeyFileReader<NWN::ResRef16>_>::operator=
          (SharedPtr<KeyFileReader<NWN::ResRef16>_> *this,
          SharedPtr<KeyFileReader<NWN::ResRef16>_> *Other)

{
  LONG_PTR LVar1;
  long *in_RSI;
  KeyFileReader<NWN::ResRef16> *in_RDI;
  KeyFileReader<NWN::ResRef16> *local_8;
  
  local_8 = in_RDI;
  if ((in_RDI->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor !=
      (_func_int **)*in_RSI) {
    if (((in_RDI->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor !=
         (_func_int **)0x0) &&
       (LVar1 = InterlockedDecrementPtr
                          ((LONG_PTR *)
                           (in_RDI->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor)
       , LVar1 == 0)) {
      SharedPtrDeleterDelete<KeyFileReader<NWN::ResRef16>>(in_RDI);
      SharedPtrDeleteSharedState((LONG_PTR *)0x219a49);
    }
    (in_RDI->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor = (_func_int **)*in_RSI
    ;
    (in_RDI->m_KeyResDir).
    super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_RSI[1];
    local_8 = in_RDI;
    if ((in_RDI->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor !=
        (_func_int **)0x0) {
      InterlockedIncrementPtr
                ((LONG_PTR *)
                 (in_RDI->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor);
      local_8 = in_RDI;
    }
  }
  return (SharedPtr<KeyFileReader<NWN::ResRef16>_> *)local_8;
}

Assistant:

SharedPtr& operator=(
			 const SharedPtr & Other
			)
		{
			if (m_SharedState == Other.m_SharedState)
				return *this;

			if (m_SharedState)
			{
				if (!InterlockedDecrementPtr( m_SharedState ))
				{
					SharedPtrDeleterDelete( m_Ptr );
					SharedPtrDeleteSharedState( m_SharedState );
				}
			}

			m_SharedState = Other.m_SharedState;
			m_Ptr         = Other.m_Ptr;

			if (m_SharedState)
				InterlockedIncrementPtr( m_SharedState );

			return *this;
		}